

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O3

void __thiscall OpenMD::AtomType::AtomType(AtomType *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict1 *pmVar2;
  key_type local_50;
  
  this->_vptr_AtomType = (_func_int **)&PTR__AtomType_00304cb8;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->everyZIG).super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->everyZIG).super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->everyZIG).super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header;
  (this->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->myValues_)._M_t._M_impl.super__Rb_tree_header;
  (this->myValues_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->myValues_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->myValues_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->myValues_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->myValues_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_00300578;
  p_Var1 = &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->base_ = this;
  this->hasBase_ = false;
  this->ident_ = -1;
  this->mass_ = 0.0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mass","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->myResponsibilities_,&local_50);
  *pmVar2 = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

AtomType::AtomType() {
    // initially, all atom types are their own base types.
    base_    = this;
    hasBase_ = false;

    // initialize to an error:
    ident_ = -1;

    // and massless:
    mass_                       = 0.0;
    myResponsibilities_["mass"] = false;
  }